

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O0

Ptr __thiscall r_comp::RepliStruct::loadReplicodeFile(RepliStruct *this,string *filename)

{
  int iVar1;
  byte bVar2;
  undefined8 uVar3;
  element_type *peVar4;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar5;
  uint64_t local_2c0;
  uint64_t b;
  uint64_t a;
  string local_2a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288 [32];
  istream local_268 [8];
  ifstream loadStream;
  string local_48 [8];
  string oldFile;
  int oldLine;
  string *filename_local;
  RepliStruct *this_local;
  Ptr *newRoot;
  
  iVar1 = (int)GlobalLine;
  std::__cxx11::string::string(local_48,(string *)GlobalFilename_abi_cxx11_);
  GlobalLine = 1;
  std::__cxx11::string::operator=((string *)GlobalFilename_abi_cxx11_,in_RDX);
  std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>(&this->type);
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_268,uVar3,8);
  bVar2 = std::ios::bad();
  if ((((bVar2 & 1) == 0) && (bVar2 = std::ios::fail(), (bVar2 & 1) == 0)) &&
     (bVar2 = std::ios::eof(), (bVar2 & 1) == 0)) {
    b = 0;
    local_2c0 = 0;
    peVar4 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    parse(peVar4,local_268,&b,&local_2c0,0);
    bVar2 = std::ios::eof();
    if ((bVar2 & 1) == 0) {
      peVar4 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::__cxx11::string::operator=
                ((string *)&peVar4->error,"Code structure error: Unmatched ) or ].\n");
    }
    std::ifstream::close();
    GlobalLine = (long)iVar1;
    std::__cxx11::string::operator=((string *)GlobalFilename_abi_cxx11_,local_48);
  }
  else {
    std::operator+((char *)local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Load: File \'");
    std::operator+(local_288,(char *)local_2a8);
    peVar4 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::__cxx11::string::operator+=((string *)&peVar4->error,(string *)local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::__cxx11::string::~string(local_2a8);
    std::ifstream::close();
  }
  a._4_4_ = 1;
  std::ifstream::~ifstream(local_268);
  std::__cxx11::string::~string(local_48);
  PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar5.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RepliStruct::Ptr RepliStruct::loadReplicodeFile(const std::string &filename)
{
    int oldLine = GlobalLine;
    std::string oldFile = GlobalFilename;
    GlobalLine = 1;
    GlobalFilename = filename;
    RepliStruct::Ptr newRoot = std::make_shared<RepliStruct>(Root);
    std::ifstream loadStream(filename.c_str());

    if (loadStream.bad() || loadStream.fail() || loadStream.eof()) {
        newRoot->error += "Load: File '" + filename + "' cannot be read! ";
        loadStream.close();
        return newRoot;
    }

    // create new Root structure
    uint64_t a = 0, b = 0;

    if (newRoot->parse(&loadStream, a, b) < 0) {
        // error is already recorded in newRoot
    }

    if (!loadStream.eof()) {
        newRoot->error = "Code structure error: Unmatched ) or ].\n";
    }

    loadStream.close();
    GlobalLine = oldLine;
    GlobalFilename = oldFile;
    return newRoot;
}